

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_dump_dot_node_edge
               (FILE *fp,ggml_cgraph *gb,ggml_tensor *node,ggml_tensor *parent,char *label)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  FILE *in_RDI;
  undefined8 in_R8;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ggml_tensor *gparent0;
  ggml_tensor *gparent;
  ggml_tensor *in_stack_ffffffffffffffa0;
  ggml_cgraph *in_stack_ffffffffffffffa8;
  ggml_tensor *local_48;
  
  pgVar1 = ggml_graph_get_parent(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pgVar2 = ggml_graph_get_parent(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_48 = in_RCX;
  if (pgVar2 != (ggml_tensor *)0x0) {
    local_48 = pgVar2;
  }
  pcVar3 = "x";
  if (pgVar2 != (ggml_tensor *)0x0) {
    pcVar3 = "g";
  }
  if (pgVar1 != (ggml_tensor *)0x0) {
    in_RDX = pgVar1;
  }
  pcVar4 = "x";
  if (pgVar1 != (ggml_tensor *)0x0) {
    pcVar4 = "g";
  }
  pcVar6 = "vee";
  if (pgVar1 != (ggml_tensor *)0x0) {
    pcVar6 = "empty";
  }
  pcVar5 = "solid";
  if (pgVar1 != (ggml_tensor *)0x0) {
    pcVar5 = "dashed";
  }
  fprintf(in_RDI,"  \"%p\":%s -> \"%p\":%s [ arrowhead = %s; style = %s; label = \"%s\"; ]\n",
          local_48,pcVar3,in_RDX,pcVar4,pcVar6,pcVar5,in_R8);
  return;
}

Assistant:

static void ggml_graph_dump_dot_node_edge(FILE * fp, const struct ggml_cgraph * gb, struct ggml_tensor * node, struct ggml_tensor * parent, const char * label)  {
    struct ggml_tensor * gparent = ggml_graph_get_parent(gb, node);
    struct ggml_tensor * gparent0 = ggml_graph_get_parent(gb, parent);
    fprintf(fp, "  \"%p\":%s -> \"%p\":%s [ arrowhead = %s; style = %s; label = \"%s\"; ]\n",
            gparent0 ? (void *) gparent0 : (void *) parent,
            gparent0 ? "g" : "x",
            gparent ? (void *) gparent : (void *) node,
            gparent ? "g" : "x",
            gparent ? "empty" : "vee",
            gparent ? "dashed" : "solid",
            label);
}